

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O2

double __thiscall
lineage::heuristics::PartitionGraph::move(PartitionGraph *this,size_t v,size_t targetPartition)

{
  uint uVar1;
  uint uVar2;
  size_t vertex1;
  size_type __n;
  long lVar3;
  size_t sVar4;
  pointer puVar5;
  pointer pRVar6;
  size_t sVar7;
  Data *pDVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  ProblemGraph *pPVar11;
  pointer pAVar12;
  __node_base *p_Var13;
  pointer puVar14;
  long *plVar15;
  long lVar16;
  reference rVar17;
  pair<bool,_unsigned_long> pVar18;
  double local_d0;
  size_t v_local;
  long local_c0;
  size_type local_b8;
  vector<bool,_std::allocator<bool>_> visited;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  pointer local_58;
  pointer local_50;
  _Map_pointer local_40;
  
  puVar5 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  v_local = v;
  if ((ulong)((long)(this->vertexLabels_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar5 >> 3) <= v) {
    poVar9 = std::operator<<((ostream *)&std::cerr,"Node: ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Failed to move. Node doesnt exist!");
LAB_00145214:
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  vertex1 = puVar5[v];
  puVar14 = (this->partitions_).
            super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = vertex1 * 0x38;
  if (puVar14[vertex1]._M_h._M_element_count < 3) {
LAB_00144ea4:
    if ((ulong)(((long)(this->partitions_).
                       super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14) / 0x38) <=
        targetPartition) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"Partition does not exist!");
      goto LAB_00145214;
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)((long)&(puVar14->_M_h)._M_buckets + lVar16),&v_local);
    std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)((this->partitions_).
                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + targetPartition),&v_local);
    (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[v_local] = targetPartition;
    buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pDVar8 = this->data_;
    pPVar11 = pDVar8->problemGraph;
    pRVar6 = (pPVar11->graph_).vertices_.
             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar12 = *(pointer *)&pRVar6[v_local].vector_;
    local_d0 = 0.0;
    sVar7 = v_local;
    for (; pAVar12 != *(pointer *)((long)(pRVar6 + sVar7) + 8); pAVar12 = pAVar12 + 1) {
      lVar16 = (long)(pPVar11->problem_->nodes).
                     super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                     super__Vector_impl_data._M_start;
      lVar3 = pAVar12->vertex_;
      uVar1 = *(uint *)(lVar16 + lVar3 * 0x18);
      uVar2 = *(uint *)(lVar16 + sVar7 * 0x18);
      if (uVar2 == uVar1) {
        sVar4 = (this->vertexLabels_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (sVar4 == vertex1) {
          local_d0 = local_d0 +
                     (pDVar8->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[pAVar12->edge_];
        }
        else if (sVar4 == targetPartition) {
          local_d0 = local_d0 -
                     (pDVar8->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[pAVar12->edge_];
        }
      }
      else {
        sVar7 = (this->vertexLabels_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3];
        if (uVar2 < uVar1) {
          pVar18 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                             (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                              vertex1,sVar7);
          if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"v=");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9," w=");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::endl<char,std::char_traits<char>>(poVar9);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"Inconsistent edges!");
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pVar18.second;
          sVar7 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                  insertEdge(&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                             targetPartition,
                             (this->vertexLabels_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[pAVar12->vertex_]);
        }
        else {
          pVar18 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                             (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                              sVar7,vertex1);
          if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Error log: edge with v=");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9,", w=");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            poVar9 = std::operator<<(poVar9,"not found!");
            std::endl<char,std::char_traits<char>>(poVar9);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar10,"Inconsistent edges!");
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pVar18.second;
          sVar7 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                  insertEdge(&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                             (this->vertexLabels_).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[pAVar12->vertex_],
                             targetPartition);
        }
        updateEdgeCost(this,sVar7,
                       -(this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[pAVar12->edge_]);
        updateEdgeCost(this,(size_t)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       (this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[pAVar12->edge_]);
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&buffer,
                   (unsigned_long *)&visited);
        pDVar8 = this->data_;
        pPVar11 = pDVar8->problemGraph;
        pRVar6 = (pPVar11->graph_).vertices_.
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar7 = v_local;
      }
    }
    removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>(this,&buffer);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
    stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &buffer);
    p_Var13 = &(this->partitions_).
               super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[vertex1]._M_h._M_before_begin;
    do {
      p_Var13 = p_Var13->_M_nxt;
      if (p_Var13 == (__node_base *)0x0) goto LAB_00144d28;
    } while (p_Var13[1]._M_nxt == (_Hash_node_base *)v_local);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&buffer,
               (value_type_conflict *)(p_Var13 + 1));
LAB_00144d28:
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    pPVar11 = this->data_->problemGraph;
    local_c0 = lVar16;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&visited,(long)(pPVar11->graph_).vertices_.
                              super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pPVar11->graph_).vertices_.
                              super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5,false);
    while (lVar16 = local_c0,
          local_58 !=
          buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
      puVar5 = local_58;
      if (local_58 == local_50) {
        puVar5 = local_40[-1] + 0x40;
      }
      __n = puVar5[-1];
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&buffer);
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,__n);
      *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
      pRVar6 = (this->data_->problemGraph->graph_).vertices_.
               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar12 = *(pointer *)&pRVar6[__n].vector_;
          pAVar12 != *(pointer *)((long)(pRVar6 + __n) + 8); pAVar12 = pAVar12 + 1) {
        if (((pAVar12->vertex_ != v_local) &&
            (rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&visited,pAVar12->vertex_), (*rVar17._M_p & rVar17._M_mask) == 0))
           && ((this->vertexLabels_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[pAVar12->vertex_] == vertex1)) {
          local_b8 = pAVar12->vertex_;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&buffer,&local_b8);
        }
        pRVar6 = (this->data_->problemGraph->graph_).vertices_.
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    plVar15 = (long *)((long)&(((this->partitions_).
                                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_h)._M_before_begin.
                              _M_nxt + local_c0);
    do {
      plVar15 = (long *)*plVar15;
      if (plVar15 == (long *)0x0) {
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&visited.super__Bvector_base<std::allocator<bool>_>);
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&buffer);
        puVar14 = (this->partitions_).
                  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00144ea4;
      }
    } while ((plVar15[1] == v_local) ||
            (rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,plVar15[1]),
            (*rVar17._M_p & rVar17._M_mask) != 0));
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&visited.super__Bvector_base<std::allocator<bool>_>);
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&buffer);
    local_d0 = INFINITY;
  }
  return local_d0;
}

Assistant:

double move(const size_t v, const size_t targetPartition)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Node: " << v << std::endl;
            throw std::runtime_error("Failed to move. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // make sure moving the node doesnt split the partition.
        if (partitions_[previousPartition].size() > 2) {

            std::stack<size_t> stack;

            for (auto it = partitions_[previousPartition].cbegin();
                 it != partitions_[previousPartition].cend(); ++it) {
                if (*it != v) {
                    stack.push(*it);
                    break;
                }
            }

            std::vector<bool> visited;
            visited.resize(this->data_.problemGraph.graph().numberOfVertices(),
                           false);

            while (!stack.empty()) {
                const auto w = stack.top();
                stack.pop();

                visited[w] = true;

                for (auto it = this->data_.problemGraph.graph()
                                   .adjacenciesFromVertexBegin(w);
                     it !=
                     this->data_.problemGraph.graph().adjacenciesFromVertexEnd(
                         w);
                     ++it) {
                    if (it->vertex() == v)
                        continue;
                    if (visited[it->vertex()])
                        continue;
                    if (vertexLabels_[it->vertex()] == previousPartition)
                        stack.push(it->vertex());
                }
            }

            for (const auto& w : partitions_[previousPartition]) {
                if (w == v) {
                    continue;
                }

                // if it would break a partition, then dont move.
                if (!visited[w]) {
                    return std::numeric_limits<double>::infinity();
                }
            }
        }

        if (targetPartition >= partitions_.size())
            throw std::runtime_error("Partition does not exist!");

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[targetPartition].insert(v);
        vertexLabels_[v] = targetPartition;

        // calculate objective change in-plane and update costs for
        // the branching.
        auto objectiveChange = .0;
        std::vector<size_t> buffer;
        for (auto it =
                 this->data_.problemGraph.graph().adjacenciesFromVertexBegin(v);
             it != this->data_.problemGraph.graph().adjacenciesFromVertexEnd(v);
             ++it) {

            // in-frame.
            if (this->data_.problemGraph.frameOfNode(v) ==
                this->data_.problemGraph.frameOfNode(it->vertex())) {

                // (v, it->vertex) becomes a cut edge.
                if (vertexLabels_[it->vertex()] == previousPartition) {
                    objectiveChange += this->data_.costs[it->edge()];

                    // (v, it->vertex) becomes an internal edge.
                } else if (vertexLabels_[it->vertex()] == targetPartition) {
                    objectiveChange -= this->data_.costs[it->edge()];
                }

            } else { // inter-frame.
                size_t previousBranchingEdge, newBranchingEdge;

                if (this->data_.problemGraph.frameOfNode(v) <
                    this->data_.problemGraph.frameOfNode(it->vertex())) {

                    const auto p = this->findEdge(previousPartition,
                                                  vertexLabels_[it->vertex()]);
                    if (!p.first) {
                        std::cerr << "v=" << previousPartition
                                  << " w=" << vertexLabels_[it->vertex()]
                                  << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        targetPartition, vertexLabels_[it->vertex()]);
                } else {
                    const auto p = this->findEdge(vertexLabels_[it->vertex()],
                                                  previousPartition);
                    if (!p.first) {
                        std::cerr
                            << "Error log: edge with v=" << previousPartition
                            << ", w=" << vertexLabels_[it->vertex()]
                            << "not found!" << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        vertexLabels_[it->vertex()], targetPartition);
                }

                updateEdgeCost(newBranchingEdge,
                               -this->data_.costs[it->edge()]);
                updateEdgeCost(previousBranchingEdge,
                               this->data_.costs[it->edge()]);

                // we will only need to check branching edges where the
                // contributing edge of v was removed whether they vanished.
                buffer.emplace_back(previousBranchingEdge);
            }
        }

        // check if we have to remove edges.
        removeVanishedEdges(buffer);

        return objectiveChange;
    }